

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

faidx_t * fai_build_core(BGZF *bgzf)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  faidx_t *idx;
  kh_s_t *pkVar4;
  ushort **ppuVar5;
  char *name;
  long lVar6;
  ulong uVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  uint local_60;
  int local_5c;
  uint64_t local_48;
  
  idx = (faidx_t *)calloc(1,0x20);
  pkVar4 = (kh_s_t *)calloc(1,0x28);
  idx->hash = pkVar4;
  lVar6 = -1;
  local_5c = -1;
  iVar11 = 0;
  name = (char *)0x0;
  local_60 = 0xffffffff;
  cVar9 = '\0';
  local_48 = 0;
LAB_0013fd27:
  do {
    do {
      iVar2 = bgzf_getc(bgzf);
      if (iVar2 < 0) {
        if (name == (char *)0x0) {
          free(idx);
          return (faidx_t *)0x0;
        }
        fai_insert_index(idx,name,(int)lVar6,local_5c,local_60,local_48);
        free(name);
        return idx;
      }
      if (iVar2 != 10) break;
      if (cVar9 == '\x01') {
        local_48 = bgzf_utell(bgzf);
        cVar9 = '\x01';
        goto LAB_0013fd27;
      }
    } while (cVar9 == '\x02' || cVar9 == '\0' && lVar6 < 0);
    if (iVar2 == 0x3e) {
      if (-1 < lVar6) {
        fai_insert_index(idx,name,(int)lVar6,local_5c,local_60,local_48);
      }
      uVar10 = bgzf_getc(bgzf);
      if ((int)uVar10 < 0) {
        uVar7 = 0;
      }
      else {
        ppuVar5 = __ctype_b_loc();
        uVar7 = 0;
        do {
          if ((*(byte *)((long)*ppuVar5 + (ulong)uVar10 * 2 + 1) & 0x20) != 0) break;
          if (iVar11 < (int)uVar7 + 2) {
            uVar3 = (int)uVar7 + 1;
            uVar3 = uVar3 >> 1 | uVar3;
            uVar3 = uVar3 >> 2 | uVar3;
            uVar3 = uVar3 >> 4 | uVar3;
            uVar3 = uVar3 >> 8 | uVar3;
            iVar11 = (uVar3 >> 0x10 | uVar3) + 1;
            name = (char *)realloc(name,(long)iVar11);
          }
          name[uVar7] = (char)uVar10;
          uVar7 = uVar7 + 1;
          uVar10 = bgzf_getc(bgzf);
        } while (-1 < (int)uVar10);
        uVar7 = uVar7 & 0xffffffff;
      }
      name[uVar7] = '\0';
      if ((int)uVar10 < 0) {
        fai_build_core_cold_1();
        return (faidx_t *)0x0;
      }
      do {
        if (uVar10 == 10) break;
        uVar10 = bgzf_getc(bgzf);
      } while (-1 < (int)uVar10);
      local_48 = bgzf_utell(bgzf);
      cVar9 = '\x01';
      lVar6 = 0;
      goto LAB_0013fd27;
    }
    if (cVar9 == '\x03') {
      fai_build_core_cold_3();
      return (faidx_t *)0x0;
    }
    uVar10 = 0;
    iVar8 = 1;
    ppuVar5 = __ctype_b_loc();
    do {
      uVar10 = ((*ppuVar5)[iVar2] >> 0xf) + uVar10;
      iVar2 = bgzf_getc(bgzf);
      iVar8 = iVar8 + 1;
      if (iVar2 < 0) break;
    } while (iVar2 != 10);
    cVar1 = cVar9;
    if (cVar9 == '\x02') {
      cVar1 = '\x03';
    }
    if ((cVar1 == '\x03') && (uVar10 != 0)) {
      fai_build_core_cold_2();
      return (faidx_t *)0x0;
    }
    lVar6 = lVar6 + (ulong)uVar10;
    if (cVar9 == '\0') {
      cVar9 = (uVar10 != local_60 || iVar8 != local_5c) * '\x02';
    }
    else {
      bVar12 = cVar9 == '\x01';
      cVar9 = cVar1;
      if (bVar12) {
        cVar9 = '\0';
        local_60 = uVar10;
        local_5c = iVar8;
      }
    }
  } while( true );
}

Assistant:

faidx_t *fai_build_core(BGZF *bgzf)
{
    char *name;
    int c;
    int l_name, m_name;
    int line_len, line_blen, state;
    int l1, l2;
    faidx_t *idx;
    uint64_t offset;
    int64_t len;

    idx = (faidx_t*)calloc(1, sizeof(faidx_t));
    idx->hash = kh_init(s);
    name = 0; l_name = m_name = 0;
    len = line_len = line_blen = -1; state = 0; l1 = l2 = -1; offset = 0;
    while ( (c=bgzf_getc(bgzf))>=0 ) {
        if (c == '\n') { // an empty line
            if (state == 1) {
                offset = bgzf_utell(bgzf);
                continue;
            } else if ((state == 0 && len < 0) || state == 2) continue;
        }
        if (c == '>') { // fasta header
            if (len >= 0)
                fai_insert_index(idx, name, len, line_len, line_blen, offset);
            l_name = 0;
            while ( (c=bgzf_getc(bgzf))>=0 && !isspace(c)) {
                if (m_name < l_name + 2) {
                    m_name = l_name + 2;
                    kroundup32(m_name);
                    name = (char*)realloc(name, m_name);
                }
                name[l_name++] = c;
            }
            name[l_name] = '\0';
            if ( c<0 ) {
                fprintf(stderr, "[fai_build_core] the last entry has no sequence\n");
                free(name); fai_destroy(idx);
                return 0;
            }
            if (c != '\n') while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            state = 1; len = 0;
            offset = bgzf_utell(bgzf);
        } else {
            if (state == 3) {
                fprintf(stderr, "[fai_build_core] inlined empty line is not allowed in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            if (state == 2) state = 3;
            l1 = l2 = 0;
            do {
                ++l1;
                if (isgraph(c)) ++l2;
            } while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            if (state == 3 && l2) {
                fprintf(stderr, "[fai_build_core] different line length in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            ++l1; len += l2;
            if (state == 1) line_len = l1, line_blen = l2, state = 0;
            else if (state == 0) {
                if (l1 != line_len || l2 != line_blen) state = 2;
            }
        }
    }
    if ( name )
        fai_insert_index(idx, name, len, line_len, line_blen, offset);
    else
    {
        free(idx);
        return NULL;
    }
    free(name);
    return idx;
}